

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  Title *this;
  Paragraph *this_00;
  undefined8 *puVar2;
  Paragraph *pPVar3;
  uint uVar4;
  ulong uVar5;
  char text [128];
  char local_b8 [136];
  
  this = (Title *)operator_new(0xa0);
  Title::Title(this);
  (*(this->super_Paragraph).super_Section._vptr_Section[3])(this,"Test Document");
  this_00 = (Paragraph *)operator_new(0xa0);
  Paragraph::Paragraph(this_00);
  (*(this_00->super_Section)._vptr_Section[3])(this_00,"...this is a document in composite");
  (*(this_00->super_Section)._vptr_Section[4])(this_00,this);
  puVar2 = (undefined8 *)operator_new__(0x50);
  uVar5 = 0;
  do {
    local_b8[0x70] = '\0';
    local_b8[0x71] = '\0';
    local_b8[0x72] = '\0';
    local_b8[0x73] = '\0';
    local_b8[0x74] = '\0';
    local_b8[0x75] = '\0';
    local_b8[0x76] = '\0';
    local_b8[0x77] = '\0';
    local_b8[0x78] = '\0';
    local_b8[0x79] = '\0';
    local_b8[0x7a] = '\0';
    local_b8[0x7b] = '\0';
    local_b8[0x7c] = '\0';
    local_b8[0x7d] = '\0';
    local_b8[0x7e] = '\0';
    local_b8[0x7f] = '\0';
    local_b8[0x60] = '\0';
    local_b8[0x61] = '\0';
    local_b8[0x62] = '\0';
    local_b8[99] = '\0';
    local_b8[100] = '\0';
    local_b8[0x65] = '\0';
    local_b8[0x66] = '\0';
    local_b8[0x67] = '\0';
    local_b8[0x68] = '\0';
    local_b8[0x69] = '\0';
    local_b8[0x6a] = '\0';
    local_b8[0x6b] = '\0';
    local_b8[0x6c] = '\0';
    local_b8[0x6d] = '\0';
    local_b8[0x6e] = '\0';
    local_b8[0x6f] = '\0';
    local_b8[0x50] = '\0';
    local_b8[0x51] = '\0';
    local_b8[0x52] = '\0';
    local_b8[0x53] = '\0';
    local_b8[0x54] = '\0';
    local_b8[0x55] = '\0';
    local_b8[0x56] = '\0';
    local_b8[0x57] = '\0';
    local_b8[0x58] = '\0';
    local_b8[0x59] = '\0';
    local_b8[0x5a] = '\0';
    local_b8[0x5b] = '\0';
    local_b8[0x5c] = '\0';
    local_b8[0x5d] = '\0';
    local_b8[0x5e] = '\0';
    local_b8[0x5f] = '\0';
    local_b8[0x40] = '\0';
    local_b8[0x41] = '\0';
    local_b8[0x42] = '\0';
    local_b8[0x43] = '\0';
    local_b8[0x44] = '\0';
    local_b8[0x45] = '\0';
    local_b8[0x46] = '\0';
    local_b8[0x47] = '\0';
    local_b8[0x48] = '\0';
    local_b8[0x49] = '\0';
    local_b8[0x4a] = '\0';
    local_b8[0x4b] = '\0';
    local_b8[0x4c] = '\0';
    local_b8[0x4d] = '\0';
    local_b8[0x4e] = '\0';
    local_b8[0x4f] = '\0';
    local_b8[0x30] = '\0';
    local_b8[0x31] = '\0';
    local_b8[0x32] = '\0';
    local_b8[0x33] = '\0';
    local_b8[0x34] = '\0';
    local_b8[0x35] = '\0';
    local_b8[0x36] = '\0';
    local_b8[0x37] = '\0';
    local_b8[0x38] = '\0';
    local_b8[0x39] = '\0';
    local_b8[0x3a] = '\0';
    local_b8[0x3b] = '\0';
    local_b8[0x3c] = '\0';
    local_b8[0x3d] = '\0';
    local_b8[0x3e] = '\0';
    local_b8[0x3f] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0x2c] = '\0';
    local_b8[0x2d] = '\0';
    local_b8[0x2e] = '\0';
    local_b8[0x2f] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    uVar1 = uVar5 + 1;
    sprintf(local_b8,"this is paragraph %d",uVar1 & 0xffffffff);
    pPVar3 = (Paragraph *)operator_new(0xa0);
    Paragraph::Paragraph(pPVar3);
    puVar2[uVar5] = pPVar3;
    (*(pPVar3->super_Section)._vptr_Section[3])(pPVar3,local_b8);
    (*(this_00->super_Section)._vptr_Section[4])(this_00,pPVar3);
    uVar5 = uVar1;
  } while (uVar1 != 10);
  uVar5 = 1;
  do {
    local_b8[0x70] = '\0';
    local_b8[0x71] = '\0';
    local_b8[0x72] = '\0';
    local_b8[0x73] = '\0';
    local_b8[0x74] = '\0';
    local_b8[0x75] = '\0';
    local_b8[0x76] = '\0';
    local_b8[0x77] = '\0';
    local_b8[0x78] = '\0';
    local_b8[0x79] = '\0';
    local_b8[0x7a] = '\0';
    local_b8[0x7b] = '\0';
    local_b8[0x7c] = '\0';
    local_b8[0x7d] = '\0';
    local_b8[0x7e] = '\0';
    local_b8[0x7f] = '\0';
    local_b8[0x60] = '\0';
    local_b8[0x61] = '\0';
    local_b8[0x62] = '\0';
    local_b8[99] = '\0';
    local_b8[100] = '\0';
    local_b8[0x65] = '\0';
    local_b8[0x66] = '\0';
    local_b8[0x67] = '\0';
    local_b8[0x68] = '\0';
    local_b8[0x69] = '\0';
    local_b8[0x6a] = '\0';
    local_b8[0x6b] = '\0';
    local_b8[0x6c] = '\0';
    local_b8[0x6d] = '\0';
    local_b8[0x6e] = '\0';
    local_b8[0x6f] = '\0';
    local_b8[0x50] = '\0';
    local_b8[0x51] = '\0';
    local_b8[0x52] = '\0';
    local_b8[0x53] = '\0';
    local_b8[0x54] = '\0';
    local_b8[0x55] = '\0';
    local_b8[0x56] = '\0';
    local_b8[0x57] = '\0';
    local_b8[0x58] = '\0';
    local_b8[0x59] = '\0';
    local_b8[0x5a] = '\0';
    local_b8[0x5b] = '\0';
    local_b8[0x5c] = '\0';
    local_b8[0x5d] = '\0';
    local_b8[0x5e] = '\0';
    local_b8[0x5f] = '\0';
    local_b8[0x40] = '\0';
    local_b8[0x41] = '\0';
    local_b8[0x42] = '\0';
    local_b8[0x43] = '\0';
    local_b8[0x44] = '\0';
    local_b8[0x45] = '\0';
    local_b8[0x46] = '\0';
    local_b8[0x47] = '\0';
    local_b8[0x48] = '\0';
    local_b8[0x49] = '\0';
    local_b8[0x4a] = '\0';
    local_b8[0x4b] = '\0';
    local_b8[0x4c] = '\0';
    local_b8[0x4d] = '\0';
    local_b8[0x4e] = '\0';
    local_b8[0x4f] = '\0';
    local_b8[0x30] = '\0';
    local_b8[0x31] = '\0';
    local_b8[0x32] = '\0';
    local_b8[0x33] = '\0';
    local_b8[0x34] = '\0';
    local_b8[0x35] = '\0';
    local_b8[0x36] = '\0';
    local_b8[0x37] = '\0';
    local_b8[0x38] = '\0';
    local_b8[0x39] = '\0';
    local_b8[0x3a] = '\0';
    local_b8[0x3b] = '\0';
    local_b8[0x3c] = '\0';
    local_b8[0x3d] = '\0';
    local_b8[0x3e] = '\0';
    local_b8[0x3f] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0x2c] = '\0';
    local_b8[0x2d] = '\0';
    local_b8[0x2e] = '\0';
    local_b8[0x2f] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    sprintf(local_b8,"\tsub-paragraph %d",uVar5);
    pPVar3 = (Paragraph *)operator_new(0xa0);
    Paragraph::Paragraph(pPVar3);
    (*(pPVar3->super_Section)._vptr_Section[3])(pPVar3,local_b8);
    (**(code **)(*(long *)*puVar2 + 0x20))((long *)*puVar2,pPVar3);
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 4);
  (*(this_00->super_Section)._vptr_Section[2])(this_00);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Paragraph* title = new Title();
	title->setText("Test Document");

	Paragraph *root = new Paragraph();
	root->setText("...this is a document in composite");

	root->appendSector(title);
	Paragraph** list = new Paragraph*[10];
	for (int i = 0; i < 10; ++i) {
		char text[128];
		memset(text, 0x00, sizeof(text));
		sprintf(text, "this is paragraph %d", i + 1);

		list[i] = new Paragraph();
		list[i]->setText(text);
		root->appendSector(list[i]);
	}

	Paragraph** subList = new Paragraph*[3];
	for (int i = 0; i < 3; ++i) {
		char text[128];
		memset(text, 0x00, sizeof(text));
		sprintf(text, "\tsub-paragraph %d", i + 1);

		subList[i] = new Paragraph();
		subList[i]->setText(text);
		list[0]->appendSector(subList[i]);
	}

	root->print();

	return 0;
}